

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::
CommandDomainReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&)::$_0::
~__0(__0 *this)

{
  if (*(__0 **)(this + 0x28) != this + 0x38) {
    operator_delete(*(__0 **)(this + 0x28));
  }
  if (*(code **)(this + 0x18) != (code *)0x0) {
    (**(code **)(this + 0x18))(this + 8,this + 8,3);
  }
  return;
}

Assistant:

Error CommissionerSafe::CommandDomainReset(const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    CommandDomainReset(wait, aDstAddr);
    return pro.get_future().get();
}